

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::parseLocalVarDeclaration(Parser *this)

{
  Token *t;
  bool bVar1;
  int iVar2;
  Node *pNVar3;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  Node *list;
  vector<Node_*,_std::allocator<Node_*>_> varKeys;
  vector<Node_*,_std::allocator<Node_*>_> varValues;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_60;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_48;
  
  t = this->tok;
  varKeys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  varValues.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  varKeys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  varKeys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  varValues.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  varValues.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  do {
    if (this->ctx->isError != false) break;
    iVar2 = accept(this,0x17,in_RDX,in_RCX);
    if ((char)iVar2 == '\0') {
      iVar2 = accept(this,0x19,__addr,in_RCX);
      if ((char)iVar2 == '\0') {
        bVar1 = expect(this,TK_IDENTIFIER);
        __addr_00 = extraout_RDX_01;
        if (bVar1) {
          list = createIdentifierNode(this,this->tok);
          std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                    ((vector<Node*,std::allocator<Node*>> *)&varKeys,&list);
          __addr_00 = extraout_RDX_02;
        }
      }
      else {
        pNVar3 = (Node *)operator_new(0x30);
        Node::Node(pNVar3,this->ctx,this->tok);
        pNVar3->nodeType = PNT_LIST_OF_KEYS_ARRAY;
        list = pNVar3;
        parseListOfVars(this,pNVar3,PNT_VAR_DECLARATOR);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&varKeys,&list);
        expect(this,TK_RSQUARE);
        __addr_00 = extraout_RDX_00;
      }
    }
    else {
      pNVar3 = (Node *)operator_new(0x30);
      Node::Node(pNVar3,this->ctx,this->tok);
      pNVar3->nodeType = PNT_LIST_OF_KEYS_TABLE;
      list = pNVar3;
      parseListOfVars(this,pNVar3,PNT_VAR_DECLARATOR);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&varKeys,&list);
      expect(this,TK_RBRACE);
      __addr_00 = extraout_RDX;
    }
    if (this->ctx->isError != false) break;
    iVar2 = accept(this,6,__addr_00,in_RCX);
    if ((char)iVar2 == '\0') {
      iVar2 = accept(this,8,__addr_01,in_RCX);
      if (((char)iVar2 == '\0') && (bVar1 = isEndOfStatement(this), !bVar1)) {
        list = (Node *)0x0;
        std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                  ((vector<Node*,std::allocator<Node*>> *)&varValues,&list);
        break;
      }
      list = (Node *)0x0;
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&varValues,&list);
      in_RDX = extraout_RDX_05;
    }
    else {
      list = parseTernaryOp(this);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&varValues,&list);
      bVar1 = isEndOfStatement(this);
      in_RDX = extraout_RDX_03;
      if (!bVar1) {
        expect(this,TK_COMMA);
        in_RDX = extraout_RDX_04;
      }
    }
  } while ((this->tok->type == TK_COMMA) ||
          (bVar1 = isEndOfStatement(this), in_RDX = extraout_RDX_06, !bVar1));
  if (varKeys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      varKeys.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    CompilationContext::error
              (this->ctx,0x7c,"expected name of variable",this->tok->line,(uint)this->tok->column);
  }
  else if (this->ctx->isError == false) {
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)&local_48,&varKeys);
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)&local_60,&varValues);
    pNVar3 = createLocalVarDeclarationNode
                       (this,t,(vector<Node_*,_std::allocator<Node_*>_> *)&local_48,
                        (vector<Node_*,_std::allocator<Node_*>_> *)&local_60);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_60);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_48);
    goto LAB_0010e4ad;
  }
  pNVar3 = (Node *)0x0;
LAB_0010e4ad:
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&varValues.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&varKeys.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  return pNVar3;
}

Assistant:

Node * parseLocalVarDeclaration()
  {
    Token * tk = tok; // = "local"
    std::vector<Node *> varKeys;
    std::vector<Node *> varValues;
    while (!ctx.isError)
    {
      if (accept(TK_LBRACE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_TABLE;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RBRACE);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_ARRAY;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RSQUARE);
      }
      else if (expect(TK_IDENTIFIER))
      {
        varKeys.push_back(createIdentifierNode(*tok));
      }

      if (ctx.isError)
        break;

      if (accept(TK_ASSIGN))
      {
        varValues.push_back(parseTernaryOp());
        if (!isEndOfStatement())
          expect(TK_COMMA);
      }
      else if (accept(TK_COMMA) || isEndOfStatement())
      {
        varValues.push_back(nullptr);
      }
      else
      {
        varValues.push_back(nullptr);
        break;
      }

      if (tok->type != TK_COMMA && isEndOfStatement())
        break;
    }

    if (varKeys.empty())
    {
      ctx.error(124, "expected name of variable", tok->line, tok->column);
      return nullptr;
    }
    return ctx.isError ? nullptr : createLocalVarDeclarationNode(*tk, varKeys, varValues);
  }